

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetUInt64
          (OptionInterpreter *this,int number,uint64 value,Type type,UnknownFieldSet *unknown_fields
          )

{
  LogMessage *pLVar1;
  LogFinisher local_49;
  LogMessage local_48;
  
  if (type == TYPE_FIXED64) {
    UnknownFieldSet::AddFixed64(unknown_fields,number,value);
    return;
  }
  if (type == TYPE_UINT64) {
    UnknownFieldSet::AddVarint(unknown_fields,number,value);
    return;
  }
  internal::LogMessage::LogMessage
            (&local_48,LOGLEVEL_FATAL,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
             ,0x1bc8);
  pLVar1 = internal::LogMessage::operator<<(&local_48,"Invalid wire type for CPPTYPE_UINT64: ");
  pLVar1 = internal::LogMessage::operator<<(pLVar1,type);
  internal::LogFinisher::operator=(&local_49,pLVar1);
  internal::LogMessage::~LogMessage(&local_48);
  return;
}

Assistant:

void DescriptorBuilder::OptionInterpreter::SetUInt64(
    int number, uint64 value, FieldDescriptor::Type type,
    UnknownFieldSet* unknown_fields) {
  switch (type) {
    case FieldDescriptor::TYPE_UINT64:
      unknown_fields->AddVarint(number, value);
      break;

    case FieldDescriptor::TYPE_FIXED64:
      unknown_fields->AddFixed64(number, value);
      break;

    default:
      GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_UINT64: " << type;
      break;
  }
}